

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O3

UChar32 icu_63::anon_unknown_10::utf16_caseContextIterator(void *context,int8_t dir)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if (dir < '\0') {
    iVar5 = *(int *)((long)context + 0x14);
    *(int *)((long)context + 0xc) = iVar5;
    *(int8_t *)((long)context + 0x1c) = dir;
LAB_002d3000:
    if (iVar5 <= *(int *)((long)context + 8)) {
      return -1;
    }
    *(int *)((long)context + 0xc) = iVar5 + -1;
    uVar2 = *(ushort *)(*context + -2 + (long)iVar5 * 2);
    uVar4 = (uint)uVar2;
    if (iVar5 + -1 <= *(int *)((long)context + 8)) {
      return uVar4;
    }
    if ((uVar2 & 0xfc00) != 0xdc00) {
      return uVar4;
    }
    uVar2 = *(ushort *)(*context + -4 + (long)iVar5 * 2);
    if ((uVar2 & 0xfc00) != 0xd800) {
      return uVar4;
    }
    *(int *)((long)context + 0xc) = iVar5 + -2;
    uVar6 = (uint)uVar2 << 10;
  }
  else {
    if (dir == '\0') {
      iVar5 = *(int *)((long)context + 0xc);
      if (*(char *)((long)context + 0x1c) < '\0') goto LAB_002d3000;
    }
    else {
      iVar5 = *(int *)((long)context + 0x18);
      *(int *)((long)context + 0xc) = iVar5;
      *(int8_t *)((long)context + 0x1c) = dir;
    }
    if (*(int *)((long)context + 0x10) <= iVar5) {
      return -1;
    }
    iVar1 = iVar5 + 1;
    *(int *)((long)context + 0xc) = iVar1;
    uVar2 = *(ushort *)(*context + (long)iVar5 * 2);
    uVar4 = (uint)uVar2;
    if ((uVar2 & 0xfc00) != 0xd800) {
      return uVar4;
    }
    if (iVar1 == *(int *)((long)context + 0x10)) {
      return uVar4;
    }
    uVar3 = *(ushort *)(*context + (long)iVar1 * 2);
    uVar6 = (uint)uVar3;
    if ((uVar3 & 0xfc00) != 0xdc00) {
      return uVar4;
    }
    *(int *)((long)context + 0xc) = iVar5 + 2;
    uVar4 = (uint)uVar2 << 10;
  }
  return uVar4 + uVar6 + -0x35fdc00;
}

Assistant:

UChar32 U_CALLCONV
utf16_caseContextIterator(void *context, int8_t dir) {
    UCaseContext *csc=(UCaseContext *)context;
    UChar32 c;

    if(dir<0) {
        /* reset for backward iteration */
        csc->index=csc->cpStart;
        csc->dir=dir;
    } else if(dir>0) {
        /* reset for forward iteration */
        csc->index=csc->cpLimit;
        csc->dir=dir;
    } else {
        /* continue current iteration direction */
        dir=csc->dir;
    }

    if(dir<0) {
        if(csc->start<csc->index) {
            U16_PREV((const UChar *)csc->p, csc->start, csc->index, c);
            return c;
        }
    } else {
        if(csc->index<csc->limit) {
            U16_NEXT((const UChar *)csc->p, csc->index, csc->limit, c);
            return c;
        }
    }
    return U_SENTINEL;
}